

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_power_unk50(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  envy_bios_power_unk50_entry *peVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = (bios->power).unk50.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar4 = (ulong)(bios->power).unk50.version;
  if ((bios->power).unk50.valid != '\0') {
    fprintf((FILE *)out,"THERMAL POLICY table at 0x%x, version %x\n",(ulong)uVar1,uVar4);
    envy_bios_dump_hex(bios,out,(bios->power).unk50.offset,(uint)(bios->power).unk50.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).unk50.entriesnum != '\0') {
      lVar3 = 0;
      uVar4 = 0;
      do {
        peVar2 = (bios->power).unk50.entries;
        if ((&peVar2->mode)[lVar3] == '\x01') {
          fprintf((FILE *)out,anon_var_dwarf_54937,
                  (double)*(ushort *)((long)&peVar2->t0 + lVar3) * 0.03125,
                  (double)*(ushort *)((long)&peVar2->t1 + lVar3) * 0.03125,
                  (double)*(ushort *)((long)&peVar2->t2 + lVar3) * 0.03125,uVar4 & 0xffffffff,1,
                  (ulong)*(ushort *)((long)&peVar2->interval_us + lVar3));
          fprintf((FILE *)out,anon_var_dwarf_5494e,
                  (double)(int)*(short *)((long)&peVar2->down_off + lVar3) * 0.03125);
          fprintf((FILE *)out,anon_var_dwarf_54959,
                  (double)(int)*(short *)((long)&peVar2->up_off + lVar3) * 0.03125);
        }
        envy_bios_dump_hex(bios,out,*(uint *)((long)&((bios->power).unk50.entries)->offset + lVar3),
                           (uint)(bios->power).unk50.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x14;
      } while (uVar4 < (bios->power).unk50.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse THERMAL POLICY table at 0x%x, version %x\n",(ulong)uVar1,
          uVar4);
  return;
}

Assistant:

void envy_bios_print_power_unk50(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk50 *unk50 = &bios->power.unk50;
	int i;

	if (!unk50->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk50->valid) {
		fprintf(out, "Failed to parse THERMAL POLICY table at 0x%x, version %x\n", unk50->offset, unk50->version);
		return;
	}

	fprintf(out, "THERMAL POLICY table at 0x%x, version %x\n", unk50->offset, unk50->version);
	envy_bios_dump_hex(bios, out, unk50->offset, unk50->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk50->entriesnum; i++) {
		struct envy_bios_power_unk50_entry *e = &unk50->entries[i];

		switch (e->mode) {
		case 1:
			fprintf(out, "%i: mode %i, t0 %.2f °C, t1 %.2f °C, t2 %.2f °C, interval %i ms\n",
				i, e->mode, (double)e->t0 / 32, (double)e->t1 / 32, (double)e->t2 / 32, e->interval_us);
			fprintf(out, "    downclock offset: %.2f °C\n", (double)e->down_off / 32);
			fprintf(out, "      upclock offset: %.2f °C\n", (double)e->up_off / 32);
			break;
		}

		envy_bios_dump_hex(bios, out, unk50->entries[i].offset, unk50->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}